

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O1

Matrix2f operator*(float f,Matrix2f *m)

{
  long lVar1;
  long in_RSI;
  Matrix2f *output;
  long lVar2;
  bool bVar3;
  undefined4 in_XMM0_Db;
  Matrix2f MVar4;
  
  MVar4.m_elements[1] = (float)in_XMM0_Db;
  MVar4.m_elements[0] = f;
  m->m_elements[0] = 0.0;
  m->m_elements[1] = 0.0;
  m->m_elements[2] = 0.0;
  m->m_elements[3] = 0.0;
  lVar1 = 0;
  do {
    lVar2 = 0;
    do {
      MVar4.m_elements[2] = *(float *)(in_RSI + lVar2 * 8) * f;
      *(float *)((long)m + lVar2 * 2 * 4) = MVar4.m_elements[2];
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    m = (Matrix2f *)((long)m + 4);
    in_RSI = in_RSI + 4;
    bVar3 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar3);
  MVar4.m_elements[3] = 0.0;
  return (Matrix2f)MVar4.m_elements;
}

Assistant:

Matrix2f operator * ( float f, const Matrix2f& m )
{
	Matrix2f output;

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			output( i, j ) = f * m( i, j );
		}
	}

	return output;
}